

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O0

bool __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
::elementBegin(ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
               *this,ParserChar *elementName,ParserAttributes *attributes)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  reference pvVar5;
  ulong uVar6;
  pointer ppVar7;
  pointer ppVar8;
  mapped_type *ppIVar9;
  pointer ppVar10;
  long *plVar11;
  StackMemoryManager *this_00;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  bool attrFreeSuccess;
  bool success;
  void *validationData;
  void *attributeData;
  FunctionStruct *functions;
  INamespaceHandler *nsHandler;
  const_iterator it;
  ElementFunctionMap *functionMapToUse;
  const_iterator nsFromMap;
  bool correctNamespace;
  bool foundElementHash;
  iterator nsIter;
  StringHash namespaceHash;
  StringHash currentNsPrefix;
  StringHashPair elementNsPair;
  ElementData newElementData;
  StringHashPair hashPair;
  value_type *in_stack_fffffffffffffe78;
  deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
  *in_stack_fffffffffffffe80;
  ParserChar *in_stack_fffffffffffffe88;
  StackMemoryManager *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  code *pcVar12;
  ParserTemplateBase *in_stack_fffffffffffffea0;
  code *local_150;
  key_type *in_stack_fffffffffffffeb8;
  map<unsigned_long,_GeneratedSaxParser::INamespaceHandler_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::INamespaceHandler_*>_>_>
  *in_stack_fffffffffffffec0;
  code *local_138;
  byte local_11a;
  undefined8 local_108;
  long local_100;
  FunctionStruct *local_f8;
  iterator local_f0;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>
  local_e8;
  iterator local_e0;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>
  local_d8;
  mapped_type local_d0;
  _Self local_c8;
  _Base_ptr local_c0;
  _Self local_b8;
  long *local_b0;
  iterator local_a8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_a0;
  iterator local_98;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_90;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  _Self in_stack_ffffffffffffff80;
  _Self local_78;
  unsigned_long local_70;
  unsigned_long local_68;
  StringHashPair local_60;
  unsigned_long local_50 [4];
  StringHashPair local_30;
  undefined8 *local_20;
  undefined8 local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  if ((((in_RDI[0x3b] != 0) || (in_RDI[0x3c] != 0)) || (in_RDI[0x3d] != 0)) &&
     (bVar1 = std::
              stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
              ::empty((stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                       *)0x8d10a5), !bVar1)) {
    pvVar5 = std::
             stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
             ::top((stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                    *)0x8d10ba);
    pvVar5->counter = pvVar5->counter + 1;
  }
  if (in_RDI[0x3b] == 0) {
    if (in_RDI[0x3c] == 0) {
      if (in_RDI[0x3d] == 0) {
        uVar6 = (**(code **)(*in_RDI + 0x38))();
        if ((uVar6 & 1) != 0) {
          parseNamespaceDeclarations
                    ((ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                      *)in_stack_ffffffffffffff80._M_node,
                     (ParserAttributes *)
                     CONCAT17(in_stack_ffffffffffffff7f,
                              CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
        }
        local_60 = Utils::calculateStringHashWithNamespace((ParserChar *)in_stack_fffffffffffffe90);
        local_50[0] = local_60.second;
        local_68 = local_60.first;
        local_70 = 0;
        bVar1 = std::
                stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                ::empty((stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                         *)0x8d126b);
        if (!bVar1) {
          pvVar5 = std::
                   stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                   ::top((stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                          *)0x8d1284);
          pvVar5->counter = pvVar5->counter + 1;
          std::
          stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
          ::top((stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                 *)0x8d12a1);
          local_78._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::find((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                       *)in_stack_fffffffffffffe78,(key_type *)0x8d12b1);
          std::
          stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
          ::top((stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
                 *)0x8d12ca);
          std::
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::end((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 *)in_stack_fffffffffffffe78);
          bVar1 = std::operator!=(&local_78,(_Self *)&stack0xffffffffffffff80);
          if (bVar1) {
            ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
                     operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *
                                )0x8d1302);
            local_70 = ppVar7->second;
          }
        }
        local_50[1] = 0;
        local_50[2] = 0;
        local_50[3] = 0;
        bVar3 = (**(code **)(*in_RDI + 0x28))(in_RDI,local_50);
        bVar3 = bVar3 & 1;
        bVar2 = 0;
        if (bVar3 != 0) {
          local_98._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::find((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                       *)in_stack_fffffffffffffe78,(key_type *)0x8d1383);
          std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
          _Rb_tree_const_iterator(&local_90,&local_98);
          local_a8._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::end((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      *)in_stack_fffffffffffffe78);
          std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
          _Rb_tree_const_iterator(&local_a0,&local_a8);
          bVar4 = std::operator!=(&local_90,&local_a0);
          bVar1 = false;
          if (bVar4) {
            ppVar8 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
                     operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>
                                 *)0x8d13ff);
            bVar1 = ppVar8->second == local_70;
          }
          if (bVar1) {
            bVar2 = 1;
          }
        }
        if (in_RDI[0x20] == 0) {
          local_b0 = in_RDI + 0x1a;
        }
        else {
          local_b0 = (long *)in_RDI[0x20];
        }
        local_b8._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::end((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                    *)in_stack_fffffffffffffe78);
        if (((bVar3 & 1) != 0) && (((bVar2 & 1) != 0 || ((*(byte *)(in_RDI + 0x3a) & 1) != 0)))) {
          local_c0 = (_Base_ptr)
                     std::
                     map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                     ::find((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                             *)in_stack_fffffffffffffe78,(key_type *)0x8d14ae);
          local_b8._M_node = local_c0;
        }
        local_c8._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::end((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                    *)in_stack_fffffffffffffe78);
        bVar1 = std::operator==(&local_b8,&local_c8);
        if (bVar1) {
          ppIVar9 = std::
                    map<unsigned_long,_GeneratedSaxParser::INamespaceHandler_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::INamespaceHandler_*>_>_>
                    ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          local_d0 = *ppIVar9;
          if (local_d0 != (mapped_type)0x0) {
            in_RDI[0x29] = (long)local_d0;
            in_RDI[0x3d] = 1;
            bVar2 = (**(code **)(*(long *)local_d0 + 0x10))(local_d0,local_50,local_18,*local_20);
            return (bool)(bVar2 & 1);
          }
          uVar6 = (**(code **)(*in_RDI + 0x30))(in_RDI,local_50);
          if ((uVar6 & 1) == 0) {
            local_e0._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                 ::find((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                         *)in_stack_fffffffffffffe78,(key_type *)0x8d15c5);
            std::
            _Rb_tree_const_iterator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>
            ::_Rb_tree_const_iterator(&local_d8,&local_e0);
            local_b8._M_node = local_d8._M_node;
            local_f0._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                 ::end((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                        *)in_stack_fffffffffffffe78);
            std::
            _Rb_tree_const_iterator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>
            ::_Rb_tree_const_iterator(&local_e8,&local_f0);
            bVar1 = std::operator!=(&local_b8,&local_e8);
            local_11a = 0;
            if (!bVar1) {
              bVar2 = local_11a;
            }
            local_11a = bVar2;
            if ((local_11a & 1) == 0) {
              in_RDI[0x3c] = 1;
            }
            else {
              in_RDI[0x3b] = 1;
            }
          }
          else {
            in_RDI[0x3c] = 1;
          }
          if (in_RDI[0x3b] != 0) {
            return true;
          }
          if (in_RDI[0x3c] != 0) {
            if (in_RDI[0x22] != 0) {
              bVar2 = (**(code **)(*(long *)in_RDI[0x22] + 0x10))
                                ((long *)in_RDI[0x22],local_18,*local_20);
              return (bool)(bVar2 & 1);
            }
            bVar1 = ParserTemplateBase::handleError
                              (in_stack_fffffffffffffea0,
                               (Severity)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                               (ErrorType)in_stack_fffffffffffffe98,
                               (StringHash)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
            if (!bVar1) {
              return true;
            }
            return false;
          }
        }
        ppVar10 = std::
                  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>
                  ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>
                                *)0x8d1736);
        local_f8 = &ppVar10->second;
        local_100 = 0;
        local_108 = 0;
        if ((ppVar10->second).validateBeginFunction != 0) {
          local_138 = (code *)(ppVar10->second).validateBeginFunction;
          plVar11 = (long *)((long)in_RDI + *(long *)&(ppVar10->second).field_0x38);
          if (((ulong)local_138 & 1) != 0) {
            local_138 = *(code **)(local_138 + *plVar11 + -1);
          }
          uVar6 = (*local_138)(plVar11,local_20,&local_100,&local_108);
          if ((uVar6 & 1) != 0) {
            pcVar12 = (code *)local_f8->beginFunction;
            plVar11 = (long *)((long)in_RDI + *(long *)&local_f8->field_0x8);
            if (((ulong)pcVar12 & 1) != 0) {
              pcVar12 = *(code **)(pcVar12 + *plVar11 + -1);
            }
            bVar2 = (*pcVar12)(plVar11,local_100);
            if (local_100 != 0) {
              in_stack_fffffffffffffe80 =
                   (deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                    *)local_f8->freeAttributesFunction;
              this_00 = (StackMemoryManager *)((long)in_RDI + *(long *)&local_f8->field_0x58);
              if (((ulong)in_stack_fffffffffffffe80 & 1) != 0) {
                in_stack_fffffffffffffe80 =
                     *(deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                       **)((long)in_stack_fffffffffffffe80 + (this_00->mActiveFrame - 1));
              }
              bVar3 = (*(code *)in_stack_fffffffffffffe80)(this_00,local_100);
              StackMemoryManager::deleteObject(this_00);
              if ((bVar3 & 1) == 0) {
                return false;
              }
            }
            if ((bool)(bVar2 & 1) == false) {
              return false;
            }
            std::
            deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
            ::push_back(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
            return (bool)(bVar2 & 1);
          }
        }
        if (local_100 != 0) {
          local_150 = (code *)local_f8->freeAttributesFunction;
          plVar11 = (long *)((long)in_RDI + *(long *)&local_f8->field_0x58);
          if (((ulong)local_150 & 1) != 0) {
            local_150 = *(code **)(local_150 + *plVar11 + -1);
          }
          (*local_150)(plVar11,local_100);
          StackMemoryManager::deleteObject(in_stack_fffffffffffffe90);
        }
        local_1 = false;
      }
      else {
        in_RDI[0x3d] = in_RDI[0x3d] + 1;
        local_30 = Utils::calculateStringHashWithNamespace((ParserChar *)in_stack_fffffffffffffe90);
        bVar2 = (**(code **)(*(long *)in_RDI[0x29] + 0x10))
                          ((long *)in_RDI[0x29],&local_30.second,local_18,*local_20);
        local_1 = (bool)(bVar2 & 1);
      }
    }
    else {
      in_RDI[0x3c] = in_RDI[0x3c] + 1;
      if (in_RDI[0x22] == 0) {
        local_1 = true;
      }
      else {
        bVar2 = (**(code **)(*(long *)in_RDI[0x22] + 0x10))((long *)in_RDI[0x22],local_18,*local_20)
        ;
        local_1 = (bool)(bVar2 & 1);
      }
    }
  }
  else {
    in_RDI[0x3b] = in_RDI[0x3b] + 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ParserTemplate<DerivedClass, ImplClass>::elementBegin( const ParserChar* elementName,
																   const ParserAttributes& attributes)
	{
        if ( (mIgnoreElements > 0 || mUnknownElements > 0 || mNamespaceElements > 0) 
            && !mNamespacesStack.empty() )
        {
            mNamespacesStack.top().counter++;
        }
        if ( mIgnoreElements > 0 )
        {
            mIgnoreElements++;
            return true;
        }
        if ( mUnknownElements > 0 )
        {
            mUnknownElements++;
            if ( mUnknownHandler != 0 )
            {
                return mUnknownHandler->elementBegin( elementName, attributes.attributes );
            }
            else
            {
                return true;
            }
        }
        if ( mNamespaceElements > 0 )
        {
            mNamespaceElements++;
            StringHashPair hashPair = Utils::calculateStringHashWithNamespace( elementName );
            return mActiveNamespaceHandler->elementBegin( hashPair.second, elementName, attributes.attributes );
        }

        if ( isDifferentNamespaceAllowed() )
        {
            parseNamespaceDeclarations( attributes );
        }
        ElementData newElementData;
        StringHashPair elementNsPair = Utils::calculateStringHashWithNamespace(elementName);
        newElementData.elementHash = elementNsPair.second;
        StringHash currentNsPrefix = elementNsPair.first;
        StringHash namespaceHash = 0;
        if ( !mNamespacesStack.empty() )
        {
            mNamespacesStack.top().counter++;
            typename NamespacePrefixesMap::iterator nsIter = mNamespacesStack.top().namespaces.find( currentNsPrefix );
            if ( nsIter != mNamespacesStack.top().namespaces.end() )
            {
                namespaceHash = nsIter->second;
            }
        }
        newElementData.generatedElementHash = 0;
        newElementData.typeID = 0;
        newElementData.validationData = 0;
        bool foundElementHash = findElementHash( newElementData );

        bool correctNamespace = false;
        if ( foundElementHash )
        {
            typename NamespacePrefixesMap::const_iterator nsFromMap = mElementToNamespaceMap.find( newElementData.generatedElementHash );
            if ( nsFromMap != mElementToNamespaceMap.end() && nsFromMap->second == namespaceHash )
            {
                correctNamespace = true;
            }
        }

        const ElementFunctionMap* functionMapToUse;
        if ( mCurrentElementFunctionMap )
            functionMapToUse = mCurrentElementFunctionMap;
        else
            functionMapToUse = &mElementFunctionMap;
        typename ElementFunctionMap::const_iterator it = functionMapToUse->end();
        if ( foundElementHash && (correctNamespace || mLaxNamespaceHandling) )
            it = functionMapToUse->find(newElementData.generatedElementHash);
		if ( it == functionMapToUse->end() )
		{
            INamespaceHandler* nsHandler = mNamespaceHandlers[ namespaceHash ];
            if ( nsHandler != 0 )
            {
                mActiveNamespaceHandler = nsHandler;
                mNamespaceElements = 1;
                return nsHandler->elementBegin( newElementData.elementHash, elementName, attributes.attributes );
            }
            if ( isXsAnyAllowed( newElementData.elementHash ) )
            {
                mUnknownElements = 1;
            }
            else
            {
                it = mElementFunctionMap.find(newElementData.elementHash);
                if ( it != mElementFunctionMap.end() && correctNamespace )
                {
                    mIgnoreElements = 1;
                }
                else
                {
                    mUnknownElements = 1;
                }
            }
            if ( mIgnoreElements )
            {
                return true;
            }
            if ( mUnknownElements )
            {
                if ( mUnknownHandler != 0 )
                {
                    return mUnknownHandler->elementBegin( elementName, attributes.attributes );
                }
                else
                {
			        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
							         ParserError::ERROR_UNKNOWN_ELEMENT,
				                     0,
				                     elementName))
			        {
				        return false;
			        }
			        else
			        {
				        return true;
			        }
                }
            }
		}
		const FunctionStruct& functions = it->second;

		void* attributeData = 0;
		void* validationData = 0;
		if ( !functions.validateBeginFunction || !(static_cast<DerivedClass*>(this)->*functions.validateBeginFunction)(attributes, &attributeData, &validationData) )
        {
            // avoid leak
            if ( attributeData )
            {
                (static_cast<DerivedClass*>(this)->*functions.freeAttributesFunction)(attributeData);
                mStackMemoryManager.deleteObject(); // attribute data
            }
			return false;
        }

		bool success = (static_cast<DerivedClass*>(this)->*functions.beginFunction)(attributeData);
		if ( attributeData )
        {
            bool attrFreeSuccess = (static_cast<DerivedClass*>(this)->*functions.freeAttributesFunction)(attributeData);
			mStackMemoryManager.deleteObject(); // attribute data
            if ( !attrFreeSuccess )
            {
                return false;
            }
        }

		if ( success )
		{
            mElementDataStack.push_back(newElementData);
			newElementData.validationData = validationData;
		}
		return success;
	}